

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::showMinimized(QWidget *this)

{
  if ((this->data->field_0x10 & 1) == 0) {
    ensurePolished(this);
    setWindowState(this,(WindowStates)((*(uint *)&this->data->field_0x10 & 6) + 1));
  }
  else {
    if ((this->data->widget_attributes & 0x8000) != 0) {
      return;
    }
    ensurePolished(this);
  }
  (**(code **)(*(long *)this + 0x68))(this,1);
  return;
}

Assistant:

void QWidget::showMinimized()
{
    bool isMin = isMinimized();
    if (isMin && isVisible())
        return;

    ensurePolished();

    if (!isMin)
        setWindowState((windowState() & ~Qt::WindowActive) | Qt::WindowMinimized);
    setVisible(true);
}